

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_APPLE_fence(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_APPLE_fence != 0) {
    glad_glGenFencesAPPLE = (PFNGLGENFENCESAPPLEPROC)(*load)("glGenFencesAPPLE");
    glad_glDeleteFencesAPPLE = (PFNGLDELETEFENCESAPPLEPROC)(*load)("glDeleteFencesAPPLE");
    glad_glSetFenceAPPLE = (PFNGLSETFENCEAPPLEPROC)(*load)("glSetFenceAPPLE");
    glad_glIsFenceAPPLE = (PFNGLISFENCEAPPLEPROC)(*load)("glIsFenceAPPLE");
    glad_glTestFenceAPPLE = (PFNGLTESTFENCEAPPLEPROC)(*load)("glTestFenceAPPLE");
    glad_glFinishFenceAPPLE = (PFNGLFINISHFENCEAPPLEPROC)(*load)("glFinishFenceAPPLE");
    glad_glTestObjectAPPLE = (PFNGLTESTOBJECTAPPLEPROC)(*load)("glTestObjectAPPLE");
    glad_glFinishObjectAPPLE = (PFNGLFINISHOBJECTAPPLEPROC)(*load)("glFinishObjectAPPLE");
  }
  return;
}

Assistant:

static void load_GL_APPLE_fence(GLADloadproc load) {
	if(!GLAD_GL_APPLE_fence) return;
	glad_glGenFencesAPPLE = (PFNGLGENFENCESAPPLEPROC)load("glGenFencesAPPLE");
	glad_glDeleteFencesAPPLE = (PFNGLDELETEFENCESAPPLEPROC)load("glDeleteFencesAPPLE");
	glad_glSetFenceAPPLE = (PFNGLSETFENCEAPPLEPROC)load("glSetFenceAPPLE");
	glad_glIsFenceAPPLE = (PFNGLISFENCEAPPLEPROC)load("glIsFenceAPPLE");
	glad_glTestFenceAPPLE = (PFNGLTESTFENCEAPPLEPROC)load("glTestFenceAPPLE");
	glad_glFinishFenceAPPLE = (PFNGLFINISHFENCEAPPLEPROC)load("glFinishFenceAPPLE");
	glad_glTestObjectAPPLE = (PFNGLTESTOBJECTAPPLEPROC)load("glTestObjectAPPLE");
	glad_glFinishObjectAPPLE = (PFNGLFINISHOBJECTAPPLEPROC)load("glFinishObjectAPPLE");
}